

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError InitializeHostApis(void)

{
  PaUtilHostApiRepresentation *pPVar1;
  int iVar2;
  PaUtilHostApiRepresentation *hostApi;
  int baseDeviceIndex;
  int initializerCount;
  int i;
  PaError result;
  
  initializerCount = 0;
  iVar2 = CountHostApiInitializers();
  hostApis_ = (PaUtilHostApiRepresentation **)PaUtil_AllocateMemory((long)iVar2 << 3);
  if (hostApis_ == (PaUtilHostApiRepresentation **)0x0) {
    initializerCount = -0x2708;
LAB_0010b506:
    TerminateHostApis();
    i = initializerCount;
  }
  else {
    hostApisCount_ = 0;
    defaultHostApiIndex_ = -1;
    deviceCount_ = 0;
    hostApi._4_4_ = 0;
    for (baseDeviceIndex = 0; baseDeviceIndex < iVar2; baseDeviceIndex = baseDeviceIndex + 1) {
      hostApis_[hostApisCount_] = (PaUtilHostApiRepresentation *)0x0;
      initializerCount =
           (*paHostApiInitializers[baseDeviceIndex])(hostApis_ + hostApisCount_,hostApisCount_);
      if (initializerCount != 0) goto LAB_0010b506;
      if (hostApis_[hostApisCount_] != (PaUtilHostApiRepresentation *)0x0) {
        pPVar1 = hostApis_[hostApisCount_];
        if ((pPVar1->info).deviceCount <= (pPVar1->info).defaultInputDevice) {
          __assert_fail("hostApi->info.defaultInputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                        ,0xf2,"PaError InitializeHostApis(void)");
        }
        if ((pPVar1->info).deviceCount <= (pPVar1->info).defaultOutputDevice) {
          __assert_fail("hostApi->info.defaultOutputDevice < hostApi->info.deviceCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/common/pa_front.c"
                        ,0xf3,"PaError InitializeHostApis(void)");
        }
        if ((defaultHostApiIndex_ == -1) &&
           (((pPVar1->info).defaultInputDevice != -1 || ((pPVar1->info).defaultOutputDevice != -1)))
           ) {
          defaultHostApiIndex_ = hostApisCount_;
        }
        (pPVar1->privatePaFrontInfo).baseDeviceIndex = (long)hostApi._4_4_;
        if ((pPVar1->info).defaultInputDevice != -1) {
          (pPVar1->info).defaultInputDevice = hostApi._4_4_ + (pPVar1->info).defaultInputDevice;
        }
        if ((pPVar1->info).defaultOutputDevice != -1) {
          (pPVar1->info).defaultOutputDevice = hostApi._4_4_ + (pPVar1->info).defaultOutputDevice;
        }
        hostApi._4_4_ = (pPVar1->info).deviceCount + hostApi._4_4_;
        deviceCount_ = (pPVar1->info).deviceCount + deviceCount_;
        hostApisCount_ = hostApisCount_ + 1;
      }
    }
    if (defaultHostApiIndex_ == -1) {
      defaultHostApiIndex_ = 0;
    }
    i = initializerCount;
  }
  return i;
}

Assistant:

static PaError InitializeHostApis( void )
{
    PaError result = paNoError;
    int i, initializerCount, baseDeviceIndex;

    initializerCount = CountHostApiInitializers();

    hostApis_ = (PaUtilHostApiRepresentation**)PaUtil_AllocateMemory(
            sizeof(PaUtilHostApiRepresentation*) * initializerCount );
    if( !hostApis_ )
    {
        result = paInsufficientMemory;
        goto error;
    }

    hostApisCount_ = 0;
    defaultHostApiIndex_ = -1; /* indicates that we haven't determined the default host API yet */
    deviceCount_ = 0;
    baseDeviceIndex = 0;

    for( i=0; i< initializerCount; ++i )
    {
        hostApis_[hostApisCount_] = NULL;

        PA_DEBUG(( "before paHostApiInitializers[%d].\n",i));

        result = paHostApiInitializers[i]( &hostApis_[hostApisCount_], hostApisCount_ );
        if( result != paNoError )
            goto error;

        PA_DEBUG(( "after paHostApiInitializers[%d].\n",i));

        if( hostApis_[hostApisCount_] )
        {
            PaUtilHostApiRepresentation* hostApi = hostApis_[hostApisCount_];
            assert( hostApi->info.defaultInputDevice < hostApi->info.deviceCount );
            assert( hostApi->info.defaultOutputDevice < hostApi->info.deviceCount );

            /* the first successfully initialized host API with a default input *or*
               output device is used as the default host API.
            */
            if( (defaultHostApiIndex_ == -1) &&
                    ( hostApi->info.defaultInputDevice != paNoDevice
                        || hostApi->info.defaultOutputDevice != paNoDevice ) )
            {
                defaultHostApiIndex_ = hostApisCount_;
            }

            hostApi->privatePaFrontInfo.baseDeviceIndex = baseDeviceIndex;

            if( hostApi->info.defaultInputDevice != paNoDevice )
                hostApi->info.defaultInputDevice += baseDeviceIndex;

            if( hostApi->info.defaultOutputDevice != paNoDevice )
                hostApi->info.defaultOutputDevice += baseDeviceIndex;

            baseDeviceIndex += hostApi->info.deviceCount;
            deviceCount_ += hostApi->info.deviceCount;

            ++hostApisCount_;
        }
    }

    /* if no host APIs have devices, the default host API is the first initialized host API */
    if( defaultHostApiIndex_ == -1 )
        defaultHostApiIndex_ = 0;

    return result;

error:
    TerminateHostApis();
    return result;
}